

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# handle_join_leave.cxx
# Opt level: O0

ptr<resp_msg> __thiscall
nuraft::raft_server::handle_join_cluster_req(raft_server *this,req_msg *req)

{
  int32_t my_id;
  undefined8 uVar1;
  log_val_type lVar2;
  bool bVar3;
  int iVar4;
  uint uVar5;
  __int_type_conflict leader_id;
  size_type sVar6;
  element_type *this_00;
  element_type *peVar7;
  element_type *peVar8;
  element_type *peVar9;
  element_type *peVar10;
  element_type *__addr_len;
  undefined8 *puVar11;
  req_msg *in_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  sockaddr *__addr;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_02;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var12;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_03;
  long in_RSI;
  element_type *in_RDI;
  ptr<resp_msg> pVar13;
  ptr<cluster_config> c_config;
  uint64_t my_term;
  Param follower_param;
  bool reset_commit_idx;
  vector<std::shared_ptr<nuraft::log_entry>,_std::allocator<std::shared_ptr<nuraft::log_entry>_>_>
  *entries;
  ptr<resp_msg> *resp;
  memory_order __b_4;
  memory_order __b_1;
  memory_order __b;
  memory_order __b_3;
  memory_order __b_2;
  ptr<cluster_config> *in_stack_000008d0;
  raft_server *in_stack_000008d8;
  undefined4 in_stack_fffffffffffffda8;
  srv_role in_stack_fffffffffffffdac;
  srv_state *in_stack_fffffffffffffdb0;
  element_type *this_01;
  cb_func *in_stack_fffffffffffffdb8;
  undefined4 in_stack_fffffffffffffdc0;
  undefined4 in_stack_fffffffffffffdc4;
  buffer *in_stack_fffffffffffffdc8;
  ulong local_158;
  Param local_150;
  string local_138 [32];
  string local_118 [35];
  byte local_f5;
  undefined4 local_f4;
  string local_f0 [48];
  int32 local_c0;
  undefined4 local_bc;
  ulong local_b8;
  byte local_a9;
  vector<std::shared_ptr<nuraft::log_entry>,_std::allocator<std::shared_ptr<nuraft::log_entry>_>_>
  *local_a8;
  req_msg *local_a0;
  undefined8 local_88;
  memory_order local_80;
  int local_7c;
  undefined8 *local_78;
  undefined8 local_70;
  memory_order local_68;
  int local_64;
  undefined8 *local_60;
  undefined8 local_58;
  memory_order local_50;
  int local_4c;
  undefined8 *local_48;
  undefined8 local_40;
  memory_order local_38;
  int local_34;
  undefined8 local_30;
  undefined8 *local_28;
  undefined8 local_20;
  memory_order local_18;
  int local_14;
  undefined8 local_10;
  undefined8 *local_8;
  
  local_a0 = in_RDX;
  local_a8 = req_msg::log_entries(in_RDX);
  local_a9 = 0;
  std::__shared_ptr_access<nuraft::srv_state,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<nuraft::srv_state,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x1a0493);
  local_b8 = srv_state::get_term((srv_state *)0x1a049b);
  local_bc = 0xd;
  local_c0 = msg_base::get_src(&local_a0->super_msg_base);
  cs_new<nuraft::resp_msg,unsigned_long,nuraft::msg_type,int&,int>
            ((unsigned_long *)in_stack_fffffffffffffdc8,
             (msg_type *)CONCAT44(in_stack_fffffffffffffdc4,in_stack_fffffffffffffdc0),
             (int *)in_stack_fffffffffffffdb8,(int *)in_stack_fffffffffffffdb0);
  sVar6 = std::
          vector<std::shared_ptr<nuraft::log_entry>,_std::allocator<std::shared_ptr<nuraft::log_entry>_>_>
          ::size(local_a8);
  if (sVar6 == 1) {
    std::
    vector<std::shared_ptr<nuraft::log_entry>,_std::allocator<std::shared_ptr<nuraft::log_entry>_>_>
    ::operator[](local_a8,0);
    this_00 = std::__shared_ptr_access<nuraft::log_entry,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              ::operator->((__shared_ptr_access<nuraft::log_entry,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)0x1a0532);
    lVar2 = log_entry::get_val_type(this_00);
    if (lVar2 == conf) {
      local_f5 = 1;
      bVar3 = std::atomic::operator_cast_to_bool((atomic<bool> *)in_stack_fffffffffffffdb8);
      if (bVar3) {
        bVar3 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)(in_RSI + 0x318));
        if (bVar3) {
          peVar7 = std::
                   __shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                   operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)0x1a06d0);
          iVar4 = (*peVar7->_vptr_logger[7])();
          if (2 < iVar4) {
            peVar7 = std::
                     __shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                     operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)0x1a0709);
            puVar11 = (undefined8 *)(in_RSI + 0xa8);
            local_4c = 5;
            local_48 = puVar11;
            local_50 = std::operator&(memory_order_seq_cst,__memory_order_mask);
            if (local_4c - 1U < 2) {
              local_58 = *puVar11;
            }
            else if (local_4c == 5) {
              local_58 = *puVar11;
            }
            else {
              local_58 = *puVar11;
            }
            uVar1 = local_58;
            puVar11 = (undefined8 *)(in_RSI + 0xa0);
            local_64 = 5;
            local_60 = puVar11;
            local_68 = std::operator&(memory_order_seq_cst,__memory_order_mask);
            if (local_64 - 1U < 2) {
              local_70 = *puVar11;
            }
            else if (local_64 == 5) {
              local_70 = *puVar11;
            }
            else {
              local_70 = *puVar11;
            }
            msg_if_given_abi_cxx11_
                      ((char *)local_118,
                       "this server is already in log syncing mode, but let\'s do it again: sm idx %lu, quick commit idx %lu, will not reset commit index"
                       ,uVar1,local_70);
            (*peVar7->_vptr_logger[8])
                      (peVar7,3,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_join_leave.cxx"
                       ,"handle_join_cluster_req",0xa2,local_118);
            std::__cxx11::string::~string(local_118);
          }
        }
        local_f5 = 0;
      }
      bVar3 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)(in_RSI + 0x318));
      if (bVar3) {
        peVar7 = std::__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)0x1a0944);
        iVar4 = (*peVar7->_vptr_logger[7])();
        if (3 < iVar4) {
          peVar7 = std::
                   __shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                   operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)0x1a097d);
          uVar5 = msg_base::get_src(&local_a0->super_msg_base);
          msg_if_given_abi_cxx11_
                    ((char *)local_138,"got join cluster req from leader %d",(ulong)uVar5);
          (*peVar7->_vptr_logger[8])
                    (peVar7,4,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_join_leave.cxx"
                     ,"handle_join_cluster_req",0xa6,local_138);
          std::__cxx11::string::~string(local_138);
        }
      }
      std::atomic<bool>::operator=
                ((atomic<bool> *)in_stack_fffffffffffffdb0,
                 SUB41(in_stack_fffffffffffffdac >> 0x18,0));
      std::atomic<nuraft::srv_role>::operator=
                ((atomic<nuraft::srv_role> *)in_stack_fffffffffffffdb0,in_stack_fffffffffffffdac);
      msg_base::get_src(&local_a0->super_msg_base);
      std::__atomic_base<int>::operator=
                ((__atomic_base<int> *)in_stack_fffffffffffffdb8,
                 (__int_type_conflict)((ulong)in_stack_fffffffffffffdb0 >> 0x20));
      if ((local_f5 & 1) != 0) {
        puVar11 = (undefined8 *)(in_RSI + 0xa8);
        local_10 = *(undefined8 *)(in_RSI + 0xb8);
        local_14 = 5;
        local_8 = puVar11;
        local_18 = std::operator&(memory_order_seq_cst,__memory_order_mask);
        local_20 = local_10;
        if (local_14 == 3) {
          *puVar11 = local_10;
        }
        else if (local_14 == 5) {
          LOCK();
          *puVar11 = local_10;
          UNLOCK();
        }
        else {
          *puVar11 = local_10;
        }
        puVar11 = (undefined8 *)(in_RSI + 0xa0);
        local_30 = *(undefined8 *)(in_RSI + 0xb8);
        local_34 = 5;
        local_28 = puVar11;
        local_38 = std::operator&(memory_order_seq_cst,__memory_order_mask);
        local_40 = local_30;
        if (local_34 == 3) {
          *puVar11 = local_30;
        }
        else if (local_34 == 5) {
          LOCK();
          *puVar11 = local_30;
          UNLOCK();
        }
        else {
          *puVar11 = local_30;
        }
      }
      std::__shared_ptr_access<nuraft::srv_state,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->((__shared_ptr_access<nuraft::srv_state,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                 )0x1a0c18);
      srv_state::set_voted_for(in_stack_fffffffffffffdb0,in_stack_fffffffffffffdac);
      std::__shared_ptr_access<nuraft::srv_state,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->((__shared_ptr_access<nuraft::srv_state,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                 )0x1a0c3b);
      msg_base::get_term(&local_a0->super_msg_base);
      srv_state::set_term(in_stack_fffffffffffffdb0,
                          CONCAT44(in_stack_fffffffffffffdac,in_stack_fffffffffffffda8));
      std::unique_ptr<nuraft::context,_std::default_delete<nuraft::context>_>::operator->
                ((unique_ptr<nuraft::context,_std::default_delete<nuraft::context>_> *)0x1a0c79);
      peVar8 = std::__shared_ptr_access<nuraft::state_mgr,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<nuraft::state_mgr,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)0x1a0c81);
      peVar9 = std::__shared_ptr_access<nuraft::srv_state,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator*((__shared_ptr_access<nuraft::srv_state,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)in_stack_fffffffffffffdb0);
      (*peVar8->_vptr_state_mgr[4])(peVar8,peVar9);
      my_id = *(int32_t *)(in_RSI + 0x38);
      leader_id = std::__atomic_base::operator_cast_to_int
                            ((__atomic_base<int> *)in_stack_fffffffffffffdb8);
      cb_func::Param::Param(&local_150,my_id,leader_id,-1,(void *)0x0);
      std::__shared_ptr_access<nuraft::srv_state,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->((__shared_ptr_access<nuraft::srv_state,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                 )0x1a0cf8);
      local_158 = srv_state::get_term((srv_state *)0x1a0d00);
      local_150.ctx = &local_158;
      std::unique_ptr<nuraft::context,_std::default_delete<nuraft::context>_>::operator->
                ((unique_ptr<nuraft::context,_std::default_delete<nuraft::context>_> *)0x1a0d38);
      cb_func::call(in_stack_fffffffffffffdb8,(Type)((ulong)in_stack_fffffffffffffdb0 >> 0x20),
                    (Param *)CONCAT44(in_stack_fffffffffffffdac,in_stack_fffffffffffffda8));
      std::
      vector<std::shared_ptr<nuraft::log_entry>,_std::allocator<std::shared_ptr<nuraft::log_entry>_>_>
      ::operator[](local_a8,0);
      std::__shared_ptr_access<nuraft::log_entry,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->((__shared_ptr_access<nuraft::log_entry,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                 )0x1a0d6c);
      log_entry::get_buf((log_entry *)CONCAT44(in_stack_fffffffffffffdc4,in_stack_fffffffffffffdc0))
      ;
      cluster_config::deserialize(in_stack_fffffffffffffdc8);
      std::unique_ptr<nuraft::context,_std::default_delete<nuraft::context>_>::operator->
                ((unique_ptr<nuraft::context,_std::default_delete<nuraft::context>_> *)0x1a0da3);
      peVar8 = std::__shared_ptr_access<nuraft::state_mgr,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<nuraft::state_mgr,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)0x1a0dab);
      peVar10 = std::
                __shared_ptr_access<nuraft::cluster_config,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                ::operator*((__shared_ptr_access<nuraft::cluster_config,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)in_stack_fffffffffffffdb0);
      (*peVar8->_vptr_state_mgr[3])(peVar8,peVar10);
      reconfigure(in_stack_000008d8,in_stack_000008d0);
      __addr_len = std::
                   __shared_ptr_access<nuraft::resp_msg,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                   operator->((__shared_ptr_access<nuraft::resp_msg,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)0x1a0df4);
      puVar11 = (undefined8 *)(in_RSI + 0xa0);
      local_7c = 5;
      this_01 = __addr_len;
      local_78 = puVar11;
      local_80 = std::operator&(memory_order_seq_cst,__memory_order_mask);
      if (local_7c - 1U < 2) {
        local_88 = *puVar11;
      }
      else if (local_7c == 5) {
        local_88 = *puVar11;
      }
      else {
        local_88 = *puVar11;
      }
      resp_msg::accept(this_01,(int)local_88 + 1,__addr,(socklen_t *)__addr_len);
      local_a9 = 1;
      local_f4 = 1;
      std::shared_ptr<nuraft::cluster_config>::~shared_ptr
                ((shared_ptr<nuraft::cluster_config> *)0x1a0ecc);
      _Var12._M_pi = extraout_RDX_02;
      goto LAB_001a0ef1;
    }
  }
  bVar3 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)(in_RSI + 0x318));
  _Var12._M_pi = extraout_RDX;
  if (bVar3) {
    peVar7 = std::__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x1a0587);
    iVar4 = (*peVar7->_vptr_logger[7])();
    _Var12._M_pi = extraout_RDX_00;
    if (3 < iVar4) {
      peVar7 = std::__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x1a05c0);
      msg_if_given_abi_cxx11_
                ((char *)local_f0,
                 "receive an invalid JoinClusterRequest as the log entry value doesn\'t meet the requirements"
                );
      (*peVar7->_vptr_logger[8])
                (peVar7,4,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_join_leave.cxx"
                 ,"handle_join_cluster_req",0x94,local_f0);
      std::__cxx11::string::~string(local_f0);
      _Var12._M_pi = extraout_RDX_01;
    }
  }
  local_a9 = 1;
  local_f4 = 1;
LAB_001a0ef1:
  if ((local_a9 & 1) == 0) {
    std::shared_ptr<nuraft::resp_msg>::~shared_ptr((shared_ptr<nuraft::resp_msg> *)0x1a0f08);
    _Var12._M_pi = extraout_RDX_03;
  }
  pVar13.super___shared_ptr<nuraft::resp_msg,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var12._M_pi;
  pVar13.super___shared_ptr<nuraft::resp_msg,_(__gnu_cxx::_Lock_policy)2>._M_ptr = in_RDI;
  return (ptr<resp_msg>)pVar13.super___shared_ptr<nuraft::resp_msg,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

ptr<resp_msg> raft_server::handle_join_cluster_req(req_msg& req) {
    std::vector<ptr<log_entry>>& entries = req.log_entries();
    ptr<resp_msg> resp = cs_new<resp_msg>
                         ( state_->get_term(),
                           msg_type::join_cluster_response,
                           id_,
                           req.get_src() );
    if ( entries.size() != 1 ||
         entries[0]->get_val_type() != log_val_type::conf ) {
        p_in("receive an invalid JoinClusterRequest as the log entry value "
             "doesn't meet the requirements");
        return resp;
    }

    // MONSTOR-8244:
    //   Adding server may be called multiple times while previous process is
    //   in progress. It should gracefully handle the new request and should
    //   not ruin the current request.
    bool reset_commit_idx = true;
    if (catching_up_) {
        p_wn("this server is already in log syncing mode, "
             "but let's do it again: sm idx %" PRIu64 ", quick commit idx %" PRIu64 ", "
             "will not reset commit index",
             sm_commit_index_.load(),
             quick_commit_index_.load());
        reset_commit_idx = false;
    }

    p_in("got join cluster req from leader %d", req.get_src());
    catching_up_ = true;
    role_ = srv_role::follower;
    leader_ = req.get_src();

    if (reset_commit_idx) {
        // MONSTOR-7503: We should not reset it to 0.
        sm_commit_index_.store( initial_commit_index_ );
        quick_commit_index_.store( initial_commit_index_ );
    }

    state_->set_voted_for(-1);
    state_->set_term(req.get_term());
    ctx_->state_mgr_->save_state(*state_);

    cb_func::Param follower_param(id_, leader_);
    uint64_t my_term = state_->get_term();
    follower_param.ctx = &my_term;
    (void) ctx_->cb_func_.call(cb_func::BecomeFollower, &follower_param);

    ptr<cluster_config> c_config = cluster_config::deserialize(entries[0]->get_buf());
    // WARNING: We should make cluster config durable here. Otherwise, if
    //          this server gets restarted before receiving the first
    //          committed config (the first config that includes this server),
    //          this server will remove itself immediately by replaying
    //          previous config which does not include this server.
    ctx_->state_mgr_->save_config(*c_config);
    reconfigure(c_config);

    resp->accept( quick_commit_index_.load() + 1 );
    return resp;
}